

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbePmaWriterInit(sqlite3_file *pFd,PmaWriter *p,int nBuf,i64 iStart)

{
  u8 *puVar1;
  int iVar2;
  i64 iStart_local;
  int nBuf_local;
  PmaWriter *p_local;
  sqlite3_file *pFd_local;
  
  memset(p,0,0x30);
  puVar1 = (u8 *)sqlite3Malloc((long)nBuf);
  p->aBuffer = puVar1;
  if (p->aBuffer == (u8 *)0x0) {
    p->eFWErr = 7;
  }
  else {
    iVar2 = (int)(iStart % (long)nBuf);
    p->iBufStart = iVar2;
    p->iBufEnd = iVar2;
    p->iWriteOff = iStart - p->iBufStart;
    p->nBuffer = nBuf;
    p->pFd = pFd;
  }
  return;
}

Assistant:

static void vdbePmaWriterInit(
  sqlite3_file *pFd,              /* File handle to write to */
  PmaWriter *p,                   /* Object to populate */
  int nBuf,                       /* Buffer size */
  i64 iStart                      /* Offset of pFd to begin writing at */
){
  memset(p, 0, sizeof(PmaWriter));
  p->aBuffer = (u8*)sqlite3Malloc(nBuf);
  if( !p->aBuffer ){
    p->eFWErr = SQLITE_NOMEM_BKPT;
  }else{
    p->iBufEnd = p->iBufStart = (iStart % nBuf);
    p->iWriteOff = iStart - p->iBufStart;
    p->nBuffer = nBuf;
    p->pFd = pFd;
  }
}